

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational_tests.cc
# Opt level: O1

void __thiscall
RationalTest_Initialization_Test::~RationalTest_Initialization_Test
          (RationalTest_Initialization_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(RationalTest, Initialization)
{
    rational_t r1, r2, r3;

    rational_init(&r1, 1, 2);
    rational_init(&r2, 300, 400);

    ASSERT_EQ(rational_numerator(&r1), 1L);
    ASSERT_EQ(rational_denominator(&r1), 2L);

    ASSERT_EQ(rational_numerator(&r2), 3L);
    ASSERT_EQ(rational_denominator(&r2), 4L);

    rational_from_rational(&r3, &r1);
    ASSERT_EQ(rational_numerator(&r3), 1L);
    ASSERT_EQ(rational_denominator(&r3), 2L);

    rational_from_long(&r3, 4L);
    ASSERT_EQ(rational_numerator(&r3), 4L);
    ASSERT_EQ(rational_denominator(&r3), 1L);
}